

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O2

void jieba_reset_separators(jieba_t *handle,char *sep)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,sep,&local_31);
  cppjieba::Jieba::ResetSeparators((Jieba *)handle,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void jieba_reset_separators(jieba_t* handle, const char* sep) {
  ((cppjieba::Jieba*)handle)->ResetSeparators(sep);
}